

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

optional<spv::Capability>
spvtools::opt::Handler_OpImageSparseRead_StorageImageReadWithoutFormat(Instruction *instruction)

{
  Op OVar1;
  IRContext *this;
  Instruction *this_00;
  Capability local_38;
  uint32_t local_34;
  Instruction *pIStack_30;
  uint32_t format;
  Instruction *type;
  uint32_t type_index;
  uint32_t image_index;
  DefUseManager *def_use_mgr;
  Instruction *instruction_local;
  
  def_use_mgr = (DefUseManager *)instruction;
  OVar1 = Instruction::opcode(instruction);
  if (OVar1 != OpImageSparseRead) {
    __assert_fail("instruction->opcode() == spv::Op::OpImageSparseRead && \"This handler only support OpImageSparseRead opcodes.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                  ,0x178,
                  "std::optional<spv::Capability> spvtools::opt::Handler_OpImageSparseRead_StorageImageReadWithoutFormat(const Instruction *)"
                 );
  }
  this = Instruction::context((Instruction *)def_use_mgr);
  _type_index = IRContext::get_def_use_mgr(this);
  type._4_4_ = Instruction::GetSingleWordInOperand((Instruction *)def_use_mgr,0);
  this_00 = analysis::DefUseManager::GetDef(_type_index,type._4_4_);
  type._0_4_ = Instruction::type_id(this_00);
  pIStack_30 = analysis::DefUseManager::GetDef(_type_index,(uint32_t)type);
  local_34 = Instruction::GetSingleWordInOperand(pIStack_30,6);
  if (local_34 == 0) {
    local_38 = CapabilityStorageImageReadWithoutFormat;
    std::optional<spv::Capability>::optional<spv::Capability,_true>
              ((optional<spv::Capability> *)&instruction_local,&local_38);
  }
  else {
    std::optional<spv::Capability>::optional((optional<spv::Capability> *)&instruction_local);
  }
  return (_Optional_base<spv::Capability,_true,_true>)
         (_Optional_base<spv::Capability,_true,_true>)instruction_local;
}

Assistant:

static std::optional<spv::Capability>
Handler_OpImageSparseRead_StorageImageReadWithoutFormat(
    const Instruction* instruction) {
  assert(instruction->opcode() == spv::Op::OpImageSparseRead &&
         "This handler only support OpImageSparseRead opcodes.");
  const auto* def_use_mgr = instruction->context()->get_def_use_mgr();

  const uint32_t image_index =
      instruction->GetSingleWordInOperand(kOpImageSparseReadImageIndex);
  const uint32_t type_index = def_use_mgr->GetDef(image_index)->type_id();
  const Instruction* type = def_use_mgr->GetDef(type_index);
  const uint32_t format = type->GetSingleWordInOperand(kOpTypeImageFormatIndex);

  return spv::ImageFormat(format) == spv::ImageFormat::Unknown
             ? std::optional(spv::Capability::StorageImageReadWithoutFormat)
             : std::nullopt;
}